

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  TokenType TVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  FieldDescriptor *__n;
  undefined1 *puVar6;
  ushort *puVar7;
  long lVar8;
  double dVar9;
  bool bVar10;
  bool bVar11;
  byte extraout_AL;
  byte extraout_AL_00;
  uint32_t uVar12;
  int32_t iVar13;
  int iVar14;
  EnumDescriptor *this_00;
  EnumValueDescriptor *value_00;
  uint64_t uVar15;
  int64_t iVar16;
  Nonnull<char_*> pcVar17;
  EnumValueDescriptor *pEVar18;
  EnumValueDescriptor *pEVar19;
  Nonnull<const_char_*> pcVar20;
  byte bVar21;
  byte bVar22;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  AlphaNum *pAVar25;
  float fVar26;
  float fVar27;
  string_view name;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_01;
  int64_t value;
  string value_8;
  int64_t int_value;
  string value_4;
  string value_9;
  undefined1 local_148 [32];
  undefined1 local_128 [16];
  undefined1 local_118 [40];
  string local_f0;
  string local_d0;
  undefined8 local_b0;
  char *local_a8;
  anon_union_8_1_a8a14541_for_iterator_2 local_a0;
  AlphaNum *local_98;
  undefined8 local_90;
  char *local_88;
  pointer local_80;
  AlphaNum *local_78;
  string local_70;
  string local_50;
  
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar10 = ConsumeSignedInteger(this,(int64_t *)local_148,0x7fffffff);
    if (!bVar10) {
LAB_00fb700d:
      bVar22 = 0;
      goto LAB_00fb7117;
    }
    bVar22 = field->field_0x1;
    bVar21 = (bVar22 & 0x20) >> 5;
    if (0xbf < bVar22 != (bool)bVar21) {
LAB_00fb72ea:
      ConsumeFieldValue();
LAB_00fb7302:
      ConsumeFieldValue();
LAB_00fb731a:
      ConsumeFieldValue();
      bVar22 = extraout_AL;
LAB_00fb7332:
      pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          ((bool)bVar21,0xbf < bVar22,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_128,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar20);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_128);
    }
    if ((bVar22 & 0x20) == 0) {
      if ((((this->no_op_fields_ == (UnsetFieldsMetadata *)0x0) ||
           (bVar10 = FieldDescriptor::has_presence(field), bVar10)) ||
          (iVar14 = (field->field_20).default_value_int32_t_,
          iVar13 = Reflection::GetInt32(reflection,message,field), iVar14 != iVar13)) ||
         ((field->field_20).default_value_int32_t_ != local_148._0_4_)) {
        Reflection::SetInt32(reflection,message,field,local_148._0_4_);
      }
      else {
LAB_00fb6e22:
        local_f0._M_dataplus._M_p = (pointer)this->no_op_fields_;
        local_128._0_8_ = message;
        local_128._8_8_ = field;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                    *)&local_d0,&local_f0,
                   (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                    *)local_128,
                   (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                    *)local_128);
      }
    }
    else {
      Reflection::AddInt32(reflection,message,field,local_148._0_4_);
    }
    break;
  case 2:
    bVar10 = ConsumeSignedInteger(this,(int64_t *)local_148,0x7fffffffffffffff);
    if (!bVar10) goto LAB_00fb700d;
    bVar22 = field->field_0x1;
    bVar21 = (bVar22 & 0x20) >> 5;
    if (0xbf < bVar22 != (bool)bVar21) goto LAB_00fb7302;
    if ((bVar22 & 0x20) == 0) {
      if (((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
          (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) &&
         ((lVar8 = (field->field_20).default_value_int64_t_,
          iVar16 = Reflection::GetInt64(reflection,message,field), lVar8 == iVar16 &&
          ((AlphaNum *)(field->field_20).default_value_int64_t_ == (AlphaNum *)local_148._0_8_))))
      goto LAB_00fb6e22;
      Reflection::SetInt64(reflection,message,field,local_148._0_8_);
    }
    else {
      Reflection::AddInt64(reflection,message,field,local_148._0_8_);
    }
    break;
  case 3:
    bVar10 = ConsumeUnsignedInteger(this,(uint64_t *)local_148,0xffffffff);
    if (!bVar10) goto LAB_00fb700d;
    bVar22 = field->field_0x1;
    bVar21 = (bVar22 & 0x20) >> 5;
    if (0xbf < bVar22 != (bool)bVar21) {
LAB_00fb72ba:
      ConsumeFieldValue();
LAB_00fb72d2:
      ConsumeFieldValue();
      goto LAB_00fb72ea;
    }
    if ((bVar22 & 0x20) == 0) {
      if (((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
          (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) &&
         ((uVar4 = (field->field_20).default_value_int32_t_,
          uVar12 = Reflection::GetUInt32(reflection,message,field), uVar4 == uVar12 &&
          ((field->field_20).default_value_int32_t_ == local_148._0_4_)))) goto LAB_00fb6e22;
      Reflection::SetUInt32(reflection,message,field,local_148._0_4_);
    }
    else {
      Reflection::AddUInt32(reflection,message,field,local_148._0_4_);
    }
    break;
  case 4:
    bVar10 = ConsumeUnsignedInteger(this,(uint64_t *)local_148,0xffffffffffffffff);
    if (!bVar10) goto LAB_00fb700d;
    bVar22 = field->field_0x1;
    bVar21 = (bVar22 & 0x20) >> 5;
    if (0xbf < bVar22 != (bool)bVar21) goto LAB_00fb72d2;
    if ((bVar22 & 0x20) == 0) {
      if ((((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
           (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) &&
          (uVar5 = (field->field_20).default_value_int64_t_,
          uVar15 = Reflection::GetUInt64(reflection,message,field), uVar5 == uVar15)) &&
         ((AlphaNum *)(field->field_20).default_value_int64_t_ == (AlphaNum *)local_148._0_8_))
      goto LAB_00fb6e22;
      Reflection::SetUInt64(reflection,message,field,local_148._0_8_);
    }
    else {
      Reflection::AddUInt64(reflection,message,field,local_148._0_8_);
    }
    break;
  case 5:
    bVar10 = ConsumeDouble(this,(double *)local_148);
    if (!bVar10) goto LAB_00fb700d;
    bVar22 = field->field_0x1;
    bVar21 = (bVar22 & 0x20) >> 5;
    if (0xbf < bVar22 != (bool)bVar21) {
      ConsumeFieldValue();
      goto LAB_00fb72ba;
    }
    if ((bVar22 & 0x20) == 0) {
      if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
         (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) {
        dVar2 = (field->field_20).default_value_double_;
        dVar9 = Reflection::GetDouble(reflection,message,field);
        if ((dVar2 == dVar9) && (!NAN(dVar2) && !NAN(dVar9))) {
          if (((field->field_20).default_value_double_ == (double)local_148._0_8_) &&
             (!NAN((field->field_20).default_value_double_) && !NAN((double)local_148._0_8_)))
          goto LAB_00fb6e22;
        }
      }
      Reflection::SetDouble(reflection,message,field,(double)local_148._0_8_);
    }
    else {
      Reflection::AddDouble(reflection,message,field,(double)local_148._0_8_);
    }
    break;
  case 6:
    bVar10 = ConsumeDouble(this,(double *)local_148);
    if (!bVar10) goto LAB_00fb700d;
    bVar22 = field->field_0x1;
    bVar21 = (bVar22 & 0x20) >> 5;
    if (0xbf < bVar22 != (bool)bVar21) goto LAB_00fb731a;
    if ((bVar22 & 0x20) == 0) {
      if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
         (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) {
        fVar26 = (field->field_20).default_value_float_;
        fVar27 = Reflection::GetFloat(reflection,message,field);
        if ((fVar26 == fVar27) && (!NAN(fVar26) && !NAN(fVar27))) {
          fVar26 = (field->field_20).default_value_float_;
          fVar27 = io::SafeDoubleToFloat((double)local_148._0_8_);
          if ((fVar26 == fVar27) && (!NAN(fVar26) && !NAN(fVar27))) goto LAB_00fb6e22;
        }
      }
      fVar26 = io::SafeDoubleToFloat((double)local_148._0_8_);
      Reflection::SetFloat(reflection,message,field,fVar26);
    }
    else {
      fVar26 = io::SafeDoubleToFloat((double)local_148._0_8_);
      Reflection::AddFloat(reflection,message,field,fVar26);
    }
    break;
  case 7:
    if ((this->tokenizer_).current_.type != TYPE_INTEGER) {
      local_128._8_8_ = (FieldDescriptor *)0x0;
      local_118[0] = '\0';
      local_128._0_8_ = (AlphaNum *)local_118;
      bVar10 = ConsumeIdentifier(this,(string *)local_128);
      if (bVar10) {
        iVar14 = std::__cxx11::string::compare(local_128);
        if (((iVar14 == 0) || (iVar14 = std::__cxx11::string::compare(local_128), iVar14 == 0)) ||
           (iVar14 = std::__cxx11::string::compare(local_128), iVar14 == 0)) {
          bVar22 = field->field_0x1;
          bVar21 = (bVar22 & 0x20) >> 5;
          if (0xbf < bVar22 != (bool)bVar21) goto LAB_00fb73bc;
          bVar11 = true;
          if ((bVar22 & 0x20) != 0) goto LAB_00fb6b98;
          if ((((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
               (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) &&
              (bVar10 = (field->field_20).default_value_bool_,
              bVar11 = Reflection::GetBool(reflection,message,field), bVar11 == bVar10)) &&
             ((field->field_20).default_value_bool_ == true)) {
            local_148._0_8_ = this->no_op_fields_;
            local_f0._M_dataplus._M_p = (pointer)message;
            local_f0._M_string_length = (size_type)field;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
            ::EmplaceDecomposable::operator()
                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                        *)&local_d0,local_148,
                       (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                        *)&local_f0,
                       (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                        *)&local_f0);
            goto LAB_00fb6ede;
          }
          bVar10 = true;
          Reflection::SetBool(reflection,message,field,true);
        }
        else {
          iVar14 = std::__cxx11::string::compare(local_128);
          if (((iVar14 != 0) && (iVar14 = std::__cxx11::string::compare(local_128), iVar14 != 0)) &&
             (iVar14 = std::__cxx11::string::compare(local_128), iVar14 != 0)) {
            puVar7 = (ushort *)(field->all_names_).payload_;
            local_d0.field_2._M_allocated_capacity = (size_type)*puVar7;
            local_d0._M_dataplus._M_p = &DAT_00000021;
            local_d0._M_string_length = 0x13ef5cf;
            local_d0.field_2._8_8_ = (long)puVar7 + ~local_d0.field_2._M_allocated_capacity;
            local_b0 = 0xb;
            local_a8 = "\". Value: \"";
            local_a0 = (anon_union_8_1_a8a14541_for_iterator_2)local_128._8_8_;
            local_98 = (AlphaNum *)local_128._0_8_;
            local_90 = 2;
            local_88 = "\".";
            pieces._M_len = (size_type)"\". Value: \"";
            pieces._M_array = (iterator)&DAT_00000005;
            absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                      (&local_f0,(strings_internal *)&local_d0,pieces);
            message_00._M_str = local_f0._M_dataplus._M_p;
            message_00._M_len = local_f0._M_string_length;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,
                              CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                       local_f0.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_00fb66e1;
          }
          bVar10 = FieldDescriptor::is_repeated(field);
          if (bVar10) {
            bVar11 = false;
LAB_00fb6b98:
            bVar10 = true;
            Reflection::AddBool(reflection,message,field,bVar11);
          }
          else if (((this->no_op_fields_ == (UnsetFieldsMetadata *)0x0) ||
                   (bVar10 = FieldDescriptor::has_presence(field), bVar10)) ||
                  ((bVar10 = (field->field_20).default_value_bool_,
                   bVar11 = Reflection::GetBool(reflection,message,field), bVar11 != bVar10 ||
                   ((field->field_20).default_value_bool_ != false)))) {
            bVar10 = true;
            Reflection::SetBool(reflection,message,field,false);
          }
          else {
            local_148._0_8_ = this->no_op_fields_;
            local_f0._M_dataplus._M_p = (pointer)message;
            local_f0._M_string_length = (size_type)field;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
            ::EmplaceDecomposable::operator()
                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                        *)&local_d0,local_148,
                       (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                        *)&local_f0,
                       (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                        *)&local_f0);
LAB_00fb6ede:
            bVar10 = true;
          }
        }
      }
      else {
LAB_00fb66e1:
        bVar10 = false;
      }
      if ((AlphaNum *)local_128._0_8_ != (AlphaNum *)local_118) {
        operator_delete((void *)local_128._0_8_,CONCAT71(local_118._1_7_,local_118[0]) + 1);
      }
      goto joined_r0x00fb7007;
    }
    bVar10 = ConsumeUnsignedInteger(this,(uint64_t *)local_148,1);
    if (!bVar10) goto LAB_00fb700d;
    bVar22 = field->field_0x1;
    bVar21 = (bVar22 & 0x20) >> 5;
    if (0xbf < bVar22 != (bool)bVar21) {
      ConsumeFieldValue();
      bVar22 = extraout_AL_00;
LAB_00fb73bc:
      pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          ((bool)bVar21,0xbf < bVar22,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar20);
      goto LAB_00fb7523;
    }
    if ((bVar22 & 0x20) == 0) {
      if ((((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
           (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) &&
          (bVar10 = (field->field_20).default_value_bool_,
          bVar11 = Reflection::GetBool(reflection,message,field), bVar11 == bVar10)) &&
         (((AlphaNum *)local_148._0_8_ == (AlphaNum *)0x0) != (field->field_20).default_value_bool_)
         ) goto LAB_00fb6e22;
      Reflection::SetBool(reflection,message,field,(AlphaNum *)local_148._0_8_ != (AlphaNum *)0x0);
    }
    else {
      Reflection::AddBool(reflection,message,field,(AlphaNum *)local_148._0_8_ != (AlphaNum *)0x0);
    }
    break;
  case 8:
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_118._32_8_ = 0x7fffffffffffffff;
    this_00 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar10 = ConsumeIdentifier(this,&local_f0);
      if (!bVar10) goto LAB_00fb70ef;
      name._M_str = local_f0._M_dataplus._M_p;
      name._M_len = local_f0._M_string_length;
      value_00 = EnumDescriptor::FindValueByName(this_00,name);
LAB_00fb6c72:
      if (value_00 == (EnumValueDescriptor *)0x0) {
        if ((local_118._32_8_ == 0x7fffffffffffffff) ||
           (bVar10 = FieldDescriptor::legacy_enum_field_treated_as_closed(field), bVar10)) {
          if (this->allow_unknown_enum_ == false) {
            puVar7 = (ushort *)(field->all_names_).payload_;
            local_a0._2_6_ = 0;
            local_a0._0_2_ = *puVar7;
            local_d0._M_dataplus._M_p = &DAT_0000001e;
            local_d0._M_string_length = 0x13ef623;
            local_d0.field_2._M_allocated_capacity = local_f0._M_string_length;
            local_d0.field_2._8_8_ = local_f0._M_dataplus._M_p;
            local_b0 = 0xd;
            local_a8 = "\" for field \"";
            local_98 = (AlphaNum *)((long)puVar7 + ~(ulong)local_a0.slot_);
            local_90 = 2;
            local_88 = "\".";
            pieces_01._M_len = local_f0._M_string_length;
            pieces_01._M_array = (iterator)&DAT_00000005;
            absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                      ((string *)local_128,(strings_internal *)&local_d0,pieces_01);
            message_03._M_str = (char *)local_128._0_8_;
            message_03._M_len = local_128._8_8_;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_03);
            if ((AlphaNum *)local_128._0_8_ != (AlphaNum *)local_118) {
              local_148._16_8_ = CONCAT71(local_118._1_7_,local_118[0]);
              pAVar25 = (AlphaNum *)local_128._0_8_;
              goto LAB_00fb70e7;
            }
            goto LAB_00fb70ef;
          }
          puVar7 = (ushort *)(field->all_names_).payload_;
          local_a0._2_6_ = 0;
          local_a0._0_2_ = *puVar7;
          local_d0._M_dataplus._M_p = &DAT_0000001e;
          local_d0._M_string_length = 0x13ef623;
          local_d0.field_2._M_allocated_capacity = local_f0._M_string_length;
          local_d0.field_2._8_8_ = local_f0._M_dataplus._M_p;
          local_b0 = 0xd;
          local_a8 = "\" for field \"";
          local_98 = (AlphaNum *)((long)puVar7 + ~(ulong)local_a0.slot_);
          local_90 = 2;
          local_88 = "\".";
          pieces_00._M_len = local_f0._M_string_length;
          pieces_00._M_array = (iterator)&DAT_00000005;
          absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                    ((string *)local_128,(strings_internal *)&local_d0,pieces_00);
          message_02._M_str = (char *)local_128._0_8_;
          message_02._M_len = local_128._8_8_;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_02);
          if ((AlphaNum *)local_128._0_8_ != (AlphaNum *)local_118) {
            operator_delete((void *)local_128._0_8_,CONCAT71(local_118._1_7_,local_118[0]) + 1);
          }
LAB_00fb6d80:
          bVar10 = true;
          field = (FieldDescriptor *)0x1;
        }
        else {
          bVar10 = FieldDescriptor::is_repeated(field);
          if (bVar10) {
            bVar10 = true;
            Reflection::AddEnumValue(reflection,message,field,local_118._32_4_);
            field = (FieldDescriptor *)0x1;
          }
          else {
            if ((((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
                 (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) &&
                (lVar8 = (field->field_20).default_value_int64_t_,
                iVar14 = Reflection::GetEnumValue(reflection,message,field), lVar8 == iVar14)) &&
               ((field->field_20).default_value_int64_t_ == local_118._32_8_)) {
              local_148._0_8_ = this->no_op_fields_;
              local_128._0_8_ = message;
              local_128._8_8_ = field;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
              ::EmplaceDecomposable::operator()
                        ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                          *)&local_d0,local_148,
                         (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                          *)local_128,
                         (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                          *)local_128);
              goto LAB_00fb6d80;
            }
            bVar10 = true;
            Reflection::SetEnumValue(reflection,message,field,local_118._32_4_);
            field = (FieldDescriptor *)0x1;
          }
        }
      }
      else {
        bVar22 = field->field_0x1;
        bVar10 = (bool)((bVar22 & 0x20) >> 5);
        if (0xbf < bVar22 != bVar10) {
          pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar10,0xbf < bVar22,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar20);
LAB_00fb7523:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_d0);
        }
        if ((bVar22 & 0x20) == 0) {
          if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
             (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) {
            pEVar18 = FieldDescriptor::default_value_enum(field);
            pEVar19 = Reflection::GetEnum(reflection,message,field);
            if ((pEVar18 == pEVar19) &&
               (pEVar18 = FieldDescriptor::default_value_enum(field), pEVar18 == value_00)) {
              local_148._0_8_ = this->no_op_fields_;
              local_128._0_8_ = message;
              local_128._8_8_ = field;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
              ::EmplaceDecomposable::operator()
                        ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                          *)&local_d0,local_148,
                         (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                          *)local_128,
                         (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                          *)local_128);
              goto LAB_00fb6de0;
            }
          }
          Reflection::SetEnum(reflection,message,field,value_00);
        }
        else {
          Reflection::AddEnum(reflection,message,field,value_00);
        }
LAB_00fb6de0:
        bVar10 = false;
      }
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"-","");
      _Var24._M_p = local_d0._M_dataplus._M_p;
      puVar6 = (undefined1 *)(this->tokenizer_).current_.text._M_string_length;
      local_78 = (AlphaNum *)message;
      if ((puVar6 == (undefined1 *)local_d0._M_string_length) &&
         ((puVar6 == (undefined1 *)0x0 ||
          (iVar14 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_d0._M_dataplus._M_p
                         ,(size_t)puVar6), iVar14 == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var24._M_p != &local_d0.field_2) {
          operator_delete(_Var24._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1));
        }
LAB_00fb6bd1:
        bVar10 = ConsumeSignedInteger(this,(int64_t *)(local_118 + 0x20),0x7fffffff);
        message = (Message *)local_78;
        paVar1 = &local_d0.field_2;
        if (bVar10) {
          pcVar17 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                              (local_118._32_8_,paVar1->_M_local_buf);
          local_d0._M_dataplus._M_p = pcVar17 + -(long)paVar1;
          local_128._0_8_ = local_118;
          local_d0._M_string_length = (size_type)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_128,paVar1,pcVar17);
          std::__cxx11::string::operator=((string *)&local_f0,(string *)local_128);
          if ((AlphaNum *)local_128._0_8_ != (AlphaNum *)local_118) {
            operator_delete((void *)local_128._0_8_,CONCAT71(local_118._1_7_,local_118[0]) + 1);
          }
          value_00 = EnumDescriptor::FindValueByNumber(this_00,local_118._32_4_);
          goto LAB_00fb6c72;
        }
      }
      else {
        TVar3 = (this->tokenizer_).current_.type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var24._M_p != &local_d0.field_2) {
          operator_delete(_Var24._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1));
        }
        if (TVar3 == TYPE_INTEGER) goto LAB_00fb6bd1;
        local_d0._M_dataplus._M_p = (pointer)0x25;
        local_d0._M_string_length = 0x13ef5fd;
        local_128._8_8_ = (this->tokenizer_).current_.text._M_dataplus._M_p;
        local_128._0_8_ = (this->tokenizer_).current_.text._M_string_length;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_148,(lts_20250127 *)&local_d0,(AlphaNum *)local_128,
                   (AlphaNum *)local_128._0_8_);
        message_01._M_str = (char *)local_148._0_8_;
        message_01._M_len = local_148._8_8_;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_01);
        pAVar25 = (AlphaNum *)local_148._0_8_;
        if ((AlphaNum *)local_148._0_8_ == (AlphaNum *)(local_148 + 0x10)) goto LAB_00fb70ef;
LAB_00fb70e7:
        operator_delete(pAVar25,local_148._16_8_ + 1);
      }
LAB_00fb70ef:
      bVar10 = true;
      field = (FieldDescriptor *)0x0;
    }
    bVar22 = (byte)field;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    if (bVar10) goto LAB_00fb7117;
    break;
  case 9:
    paVar1 = &local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_allocated_capacity =
         local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    bVar10 = ConsumeString(this,&local_d0);
    if (bVar10) {
      bVar22 = field->field_0x1;
      bVar21 = (bVar22 & 0x20) >> 5;
      if (0xbf < bVar22 != (bool)bVar21) goto LAB_00fb7332;
      if ((bVar22 & 0x20) == 0) {
        if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
           (bVar11 = FieldDescriptor::has_presence(field), !bVar11)) {
          local_80 = (((field->field_20).default_value_string_)->_M_dataplus)._M_p;
          __n = (FieldDescriptor *)((field->field_20).default_value_string_)->_M_string_length;
          Reflection::GetString_abi_cxx11_((string *)local_128,reflection,message,field);
          if ((__n == (FieldDescriptor *)local_128._8_8_) &&
             ((__n == (FieldDescriptor *)0x0 ||
              (iVar14 = bcmp(local_80,(void *)local_128._0_8_,(size_t)__n), iVar14 == 0)))) {
            puVar6 = (undefined1 *)((field->field_20).default_value_string_)->_M_string_length;
            if ((puVar6 != (undefined1 *)local_d0._M_string_length) ||
               ((puVar6 != (undefined1 *)0x0 &&
                (iVar14 = bcmp((((field->field_20).default_value_string_)->_M_dataplus)._M_p,
                               local_d0._M_dataplus._M_p,(size_t)puVar6), iVar14 != 0))))
            goto LAB_00fb6ae7;
            bVar11 = true;
          }
          else {
LAB_00fb6ae7:
            bVar11 = false;
          }
          if ((AlphaNum *)local_128._0_8_ != (AlphaNum *)local_118) {
            operator_delete((void *)local_128._0_8_,CONCAT71(local_118._1_7_,local_118[0]) + 1);
          }
          if (bVar11) {
            local_148._0_8_ = this->no_op_fields_;
            local_f0._M_dataplus._M_p = (pointer)message;
            local_f0._M_string_length = (size_type)field;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
            ::EmplaceDecomposable::operator()
                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                        *)local_128,local_148,
                       (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                        *)&local_f0,
                       (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                        *)&local_f0);
            goto LAB_00fb6fe7;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == paVar1) {
          local_70.field_2._8_8_ = local_d0.field_2._8_8_;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70._M_dataplus._M_p = local_d0._M_dataplus._M_p;
        }
        local_70.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
        local_70._M_string_length = local_d0._M_string_length;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_allocated_capacity =
             local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        Reflection::SetString(reflection,message,field,&local_70);
        uVar23 = local_70.field_2._M_allocated_capacity;
        _Var24._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_00fb6fe7;
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == paVar1) {
          local_50.field_2._8_8_ = local_d0.field_2._8_8_;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50._M_dataplus._M_p = local_d0._M_dataplus._M_p;
        }
        local_50.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
        local_50._M_string_length = local_d0._M_string_length;
        local_d0._M_string_length = 0;
        local_d0.field_2._M_allocated_capacity =
             local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        Reflection::AddString(reflection,message,field,&local_50);
        uVar23 = local_50.field_2._M_allocated_capacity;
        _Var24._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00fb6fe7;
      }
      operator_delete(_Var24._M_p,(ulong)&((FieldDescriptor *)uVar23)->field_0x1);
    }
LAB_00fb6fe7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1))
      ;
    }
joined_r0x00fb7007:
    if (!bVar10) goto LAB_00fb700d;
    break;
  case 10:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x3aa);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_d0,(char (*) [45])"Reached an unintended state: CPPTYPE_MESSAGE"
              );
    goto LAB_00fb7523;
  }
  bVar22 = 1;
LAB_00fb7117:
  return (bool)(bVar22 & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
// When checking for no-op operations, We verify that both the existing value in
// the message and the new value are the default. If the existing field value is
// not the default, setting it to the default should not be treated as a no-op.
// The pointer of this is kept in no_op_fields_ for bookkeeping.
#define SET_FIELD(CPPTYPE, CPPTYPELCASE, VALUE)                    \
  if (field->is_repeated()) {                                      \
    reflection->Add##CPPTYPE(message, field, VALUE);               \
  } else {                                                         \
    if (no_op_fields_ && !field->has_presence() &&                 \
        field->default_value_##CPPTYPELCASE() ==                   \
            reflection->Get##CPPTYPE(*message, field) &&           \
        field->default_value_##CPPTYPELCASE() == VALUE) {          \
      no_op_fields_->ids_.insert(                                  \
          UnsetFieldsMetadata::GetUnsetFieldId(*message, *field)); \
    } else {                                                       \
      reflection->Set##CPPTYPE(message, field, std::move(VALUE));  \
    }                                                              \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64_t value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, int32, static_cast<int32_t>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64_t value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, uint32, static_cast<uint32_t>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64_t value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64_t value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, uint64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, string, std::move(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64_t value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, bool, static_cast<bool>(value));
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, bool, false);
          } else {
            ReportError(absl::StrCat("Invalid value for boolean field \"",
                                     field->name(), "\". Value: \"", value,
                                     "\"."));
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64_t int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = absl::StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError(absl::StrCat("Expected integer or identifier, got: ",
                                   tokenizer_.current().text));
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              !field->legacy_enum_field_treated_as_closed()) {
            SET_FIELD(EnumValue, int64, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError(absl::StrCat("Unknown enumeration value of \"", value,
                                     "\" for field \"", field->name(), "\"."));
            return false;
          } else {
            ReportWarning(absl::StrCat("Unknown enumeration value of \"", value,
                                       "\" for field \"", field->name(),
                                       "\"."));
            return true;
          }
        }

        SET_FIELD(Enum, enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        ABSL_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }